

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimulationIslandManager.cpp
# Opt level: O0

void __thiscall
btSimulationIslandManager::btSimulationIslandManager(btSimulationIslandManager *this)

{
  undefined8 *in_RDI;
  btAlignedObjectArray<btPersistentManifold_*> *this_00;
  
  *in_RDI = &PTR__btSimulationIslandManager_002e3978;
  this_00 = (btAlignedObjectArray<btPersistentManifold_*> *)(in_RDI + 1);
  btUnionFind::btUnionFind((btUnionFind *)0x1a179b);
  btAlignedObjectArray<btPersistentManifold_*>::btAlignedObjectArray(this_00);
  btAlignedObjectArray<btCollisionObject_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btCollisionObject_*> *)this_00);
  *(undefined1 *)(in_RDI + 0xd) = 1;
  return;
}

Assistant:

btSimulationIslandManager::btSimulationIslandManager():
m_splitIslands(true)
{
}